

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O1

Entry * __thiscall
Lib::DHMap<unsigned_int,_Lib::DArray<signed_char>_*,_Lib::DefaultHash,_Lib::DefaultHash2>::findEntry
          (DHMap<unsigned_int,_Lib::DArray<signed_char>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
           *this,uint *key)

{
  uint uVar1;
  uint uVar2;
  Entry *pEVar3;
  uint uVar4;
  Entry *pEVar5;
  size_t i;
  long lVar6;
  ulong uVar7;
  Entry *pEVar8;
  uint local_c;
  
  uVar1 = this->_capacity;
  if (uVar1 == 0) {
    pEVar8 = (Entry *)0x0;
  }
  else {
    local_c = *key;
    uVar4 = 0x811c9dc5;
    lVar6 = 0;
    do {
      uVar4 = (*(byte *)((long)&local_c + lVar6) ^ uVar4) * 0x1000193;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    uVar7 = (ulong)uVar4 % (ulong)uVar1;
    pEVar3 = this->_entries;
    uVar4 = pEVar3[uVar7].field_0._infoData;
    uVar2 = this->_timestamp;
    pEVar8 = (Entry *)0x0;
    if (uVar4 >> 2 == uVar2) {
      pEVar5 = pEVar3 + uVar7;
      if (pEVar5->_key == local_c) {
        uVar4 = uVar4 & 1;
      }
      else {
        if ((uVar4 & 2) == 0) {
          return (Entry *)0x0;
        }
        do {
          uVar7 = (ulong)((int)uVar7 + local_c % uVar1 + (uint)(local_c % uVar1 == 0)) %
                  (ulong)uVar1;
          pEVar5 = pEVar3 + uVar7;
          uVar4 = (uint)pEVar3[uVar7].field_0._infoData >> 2;
          if (uVar4 != uVar2) break;
        } while (pEVar5->_key != local_c);
        uVar4 = pEVar3[uVar7].field_0._infoData & 1U | uVar4 ^ uVar2;
      }
      pEVar8 = (Entry *)0x0;
      if (uVar4 == 0) {
        pEVar8 = pEVar5;
      }
    }
  }
  return pEVar8;
}

Assistant:

const Entry* findEntry(Key const& key) const
  {
    if (_capacity == 0) return nullptr;
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    unsigned pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }
    if(res->_key==key) {
      return res->_info.deleted ? 0 : res;
    }

    //We have a collision...

    if(!res->_info.collision) {
      //There were no collisions on this position during inserting,
      //so the key we're searching for isn't here anyway
      return 0;
    }

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);

    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }

    ASS(res->_key==key);
    return res->_info.deleted ? 0 : res;
  }